

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Expression * __thiscall
wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::
replaceCurrent(Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
               *this,Expression *expression)

{
  Function *pFVar1;
  Expression *pEVar2;
  long *plVar3;
  undefined8 uVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  Expression *local_38;
  
  pFVar1 = this->currFunction;
  if ((pFVar1 != (Function *)0x0) && (pEVar2 = *this->replacep, *(long *)&pFVar1->field_0xf0 != 0))
  {
    local_38 = expression;
    sVar5 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&pFVar1->debugLocations,&local_38);
    if (sVar5 == 0) {
      uVar7 = (ulong)pEVar2 % *(ulong *)&pFVar1->field_0xe0;
      plVar8 = *(long **)(*(long *)&pFVar1->debugLocations + uVar7 * 8);
      plVar9 = (long *)0x0;
      if ((plVar8 != (long *)0x0) &&
         (plVar3 = (long *)*plVar8, plVar9 = plVar8, (Expression *)((long *)*plVar8)[1] != pEVar2))
      {
        while (plVar8 = plVar3, plVar3 = (long *)*plVar8, plVar3 != (long *)0x0) {
          plVar9 = (long *)0x0;
          if (((ulong)plVar3[1] % *(ulong *)&pFVar1->field_0xe0 != uVar7) ||
             (plVar9 = plVar8, (Expression *)plVar3[1] == pEVar2)) goto LAB_0012d4c8;
        }
        plVar9 = (long *)0x0;
      }
LAB_0012d4c8:
      if (plVar9 == (long *)0x0) {
        lVar10 = 0;
      }
      else {
        lVar10 = *plVar9;
      }
      if (lVar10 != 0) {
        pmVar6 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pFVar1->debugLocations,&local_38);
        uVar4 = *(undefined8 *)(lVar10 + 0x18);
        *(undefined8 *)
         &(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
             *(undefined8 *)(lVar10 + 0x10);
        *(undefined8 *)
         ((long)&(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = uVar4;
        *(undefined8 *)
         ((long)&(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = *(undefined8 *)(lVar10 + 0x20);
      }
    }
  }
  *this->replacep = expression;
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      debuginfo::copyOriginalToReplacement(
        getCurrent(), expression, currFunction);
    }
    return *replacep = expression;
  }